

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.hpp
# Opt level: O0

void __thiscall lightconf::group::set<int>(group *this,path *key,int *val)

{
  iterator first;
  iterator last;
  value local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  undefined1 local_58 [8];
  path key_rest;
  value *result;
  group *parent_group;
  group *parent_group_const;
  value *result_const;
  int *val_local;
  path *key_local;
  group *this_local;
  
  result_const = (value *)val;
  val_local = (int *)key;
  key_local = (path *)this;
  path::path((path *)local_58);
  local_60._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::begin_abi_cxx11_<lightconf::path>((path *)val_local);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::end_abi_cxx11_<lightconf::path>((path *)val_local);
  key_rest.parts_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)find_value<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (this,local_60,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_78,&parent_group,(path *)local_58);
  parent_group_const =
       (group *)key_rest.parts_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if ((value *)key_rest.parts_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage == (value *)0x0) {
    first = std::begin_abi_cxx11_<lightconf::path>((path *)local_58);
    last = std::end_abi_cxx11_<lightconf::path>((path *)local_58);
    create_value<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,int>
              (parent_group,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )first._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )last._M_current,(int *)result_const);
  }
  else {
    value_type_info<int>::create_value(&local_110,(int *)result_const);
    value::operator=((value *)key_rest.parts_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_110);
    value::~value(&local_110);
  }
  path::~path((path *)local_58);
  return;
}

Assistant:

inline void group::set(const path& key, const T& val) {
    const value *result_const;
    const group *parent_group_const;
    group *parent_group;
    value *result;
    path key_rest;

    result_const = find_value(std::begin(key), std::end(key), &parent_group_const, &key_rest);

    parent_group = const_cast<group *>(parent_group_const);
    result = const_cast<value *>(result_const);

    if (result) {
        *result = value_type_info<T>::create_value(val);
    } else {
        parent_group->create_value(std::begin(key_rest), std::end(key_rest), val);
    }
}